

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

int Extra_ThreshHeuristic(word *t,int nVars,int *pW)

{
  bool bVar1;
  int iVar2;
  int nWords;
  DdManager *dd_00;
  Vec_Str_t *vCube_00;
  DdNode *n;
  char *pIsop_00;
  DdNode *n_00;
  char *pIsopFneg_00;
  char *pIsopFneg;
  char *pIsop;
  DdNode *ddNodeFneg;
  DdNode *ddNode;
  Vec_Str_t *vCube;
  DdManager *dd;
  int local_80;
  int T;
  int i;
  int nChows;
  int Chow [16];
  int Chow0;
  int *pW_local;
  int nVars_local;
  word *t_local;
  
  if (nVars < 2) {
    t_local._4_4_ = 1;
  }
  else {
    iVar2 = Abc_TtIsUnate(t,nVars);
    if (iVar2 == 0) {
      t_local._4_4_ = 0;
    }
    else {
      Abc_TtMakePosUnate(t,nVars);
      Extra_ThreshComputeChow(t,nVars,&i);
      Extra_ThreshSortByChowInverted(t,nVars,&i);
      iVar2 = Extra_ThreshInitializeChow(nVars,&i);
      dd_00 = (DdManager *)Abc_FrameReadManDd();
      vCube_00 = Vec_StrAlloc(nVars);
      for (local_80 = 0; local_80 < nVars; local_80 = local_80 + 1) {
        Cudd_bddIthVar(dd_00,local_80);
      }
      n = Kit_TruthToBdd(dd_00,(uint *)t,nVars,0);
      Cudd_Ref(n);
      pIsop_00 = Abc_ConvertBddToSop((Mem_Flex_t *)0x0,dd_00,n,n,nVars,1,vCube_00,1);
      nWords = Abc_TruthWordNum(nVars);
      Abc_TtNot(t,nWords);
      n_00 = Kit_TruthToBdd(dd_00,(uint *)t,nVars,0);
      Cudd_Ref(n_00);
      pIsopFneg_00 = Abc_ConvertBddToSop((Mem_Flex_t *)0x0,dd_00,n_00,n_00,nVars,1,vCube_00,1);
      Cudd_RecursiveDeref(dd_00,n);
      Cudd_RecursiveDeref(dd_00,n_00);
      dd._4_4_ = Extra_ThreshAssignWeights(t,pIsop_00,pIsopFneg_00,nVars,pW,&i,iVar2,1);
      local_80 = 2;
      while( true ) {
        bVar1 = false;
        if ((local_80 < 4) && (bVar1 = false, dd._4_4_ == 0)) {
          bVar1 = 5 < nVars;
        }
        if (!bVar1) break;
        dd._4_4_ = Extra_ThreshAssignWeights(t,pIsop_00,pIsopFneg_00,nVars,pW,&i,iVar2,local_80);
        local_80 = local_80 + 1;
      }
      free(pIsop_00);
      free(pIsopFneg_00);
      Vec_StrFree(vCube_00);
      t_local._4_4_ = dd._4_4_;
    }
  }
  return t_local._4_4_;
}

Assistant:

int Extra_ThreshHeuristic(word * t, int nVars, int * pW) {

    extern char * Abc_ConvertBddToSop( Mem_Flex_t * pMan, DdManager * dd, DdNode * bFuncOn, DdNode * bFuncOnDc, int nFanins, int fAllPrimes, Vec_Str_t * vCube, int fMode );
    int Chow0, Chow[16], nChows, i, T = 0;
    DdManager * dd;
    Vec_Str_t * vCube;
    DdNode * ddNode, * ddNodeFneg;
    char * pIsop, * pIsopFneg;
    if (nVars <= 1)
        return 1;
    if (!Abc_TtIsUnate(t, nVars))
        return 0;
    Abc_TtMakePosUnate(t, nVars);
    Chow0 = Extra_ThreshComputeChow(t, nVars, Chow);
    Extra_ThreshSortByChowInverted(t, nVars, Chow);
    nChows = Extra_ThreshInitializeChow(nVars, Chow);

    dd = (DdManager *) Abc_FrameReadManDd();
    vCube = Vec_StrAlloc(nVars);
    for (i = 0; i < nVars; i++)
        Cudd_bddIthVar(dd, i);
    ddNode = Kit_TruthToBdd(dd, (unsigned *) t, nVars, 0);
    Cudd_Ref(ddNode);
    pIsop = Abc_ConvertBddToSop( NULL, dd, ddNode, ddNode, nVars, 1,
            vCube, 1);

    Abc_TtNot(t, Abc_TruthWordNum(nVars));
    ddNodeFneg = Kit_TruthToBdd(dd, (unsigned *) t, nVars, 0);
    Cudd_Ref(ddNodeFneg);

    pIsopFneg = Abc_ConvertBddToSop( NULL, dd, ddNodeFneg, ddNodeFneg,
            nVars, 1, vCube, 1);

    Cudd_RecursiveDeref(dd, ddNode);
    Cudd_RecursiveDeref(dd, ddNodeFneg);

    T = Extra_ThreshAssignWeights(t, pIsop, pIsopFneg, nVars, pW, Chow, nChows,
            1);

    for (i = 2; (i < 4) && (T == 0) && (nVars >= 6); i++)
        T = Extra_ThreshAssignWeights(t, pIsop, pIsopFneg, nVars, pW, Chow,
                nChows, i);

    free(pIsop);
    free(pIsopFneg);
    Vec_StrFree(vCube);

    return T;
}